

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_bcread.c
# Opt level: O0

GCproto * lj_bcread(LexState *ls)

{
  lua_State *L_00;
  char *pcVar1;
  TValue *pTVar2;
  int iVar3;
  uint32_t len_00;
  GCproto *pGVar4;
  char *startp;
  MSize len;
  GCproto *pt;
  lua_State *L;
  LexState *ls_local;
  uint32_t v;
  
  L_00 = ls->L;
  ls->lastline = (int)L_00->top - (int)(L_00->stack).ptr64;
  (ls->sb).w = (ls->sb).b;
  iVar3 = bcread_header(ls);
  if (iVar3 == 0) {
    bcread_error(ls,LJ_ERR_BCFMT);
  }
  while ((ls->pe <= ls->p || (*ls->p != '\0'))) {
    if ((uint)((int)ls->pe - (int)ls->p) < 5) {
      bcread_fill(ls,5,0);
    }
    len_00 = lj_buf_ruleb128(&ls->p);
    if (len_00 == 0) goto LAB_0017598b;
    if ((uint)((int)ls->pe - (int)ls->p) < len_00) {
      bcread_fill(ls,len_00,1);
    }
    pcVar1 = ls->p;
    pGVar4 = lj_bcread_proto(ls);
    if (ls->p != pcVar1 + len_00) {
      bcread_error(ls,LJ_ERR_BCBAD);
    }
    L_00->top->u64 = (ulong)pGVar4 | 0xfffc000000000000;
    pTVar2 = L_00->top;
    L_00->top = pTVar2 + 1;
    if ((TValue *)(L_00->maxstack).ptr64 <= pTVar2 + 1) {
      lj_state_growstack1(L_00);
    }
  }
  ls->p = ls->p + 1;
LAB_0017598b:
  if (((ls->pe != ls->p) && (ls->endmark == 0)) ||
     (L_00->top + -1 != (TValue *)((L_00->stack).ptr64 + (long)ls->lastline))) {
    bcread_error(ls,LJ_ERR_BCBAD);
  }
  L_00->top = L_00->top + -1;
  return (GCproto *)(L_00->top->u64 & 0x7fffffffffff);
}

Assistant:

GCproto *lj_bcread(LexState *ls)
{
  lua_State *L = ls->L;
  lj_assertLS(ls->c == BCDUMP_HEAD1, "bad bytecode header");
  bcread_savetop(L, ls, L->top);
  lj_buf_reset(&ls->sb);
  /* Check for a valid bytecode dump header. */
  if (!bcread_header(ls))
    bcread_error(ls, LJ_ERR_BCFMT);
  for (;;) {  /* Process all prototypes in the bytecode dump. */
    GCproto *pt;
    MSize len;
    const char *startp;
    /* Read length. */
    if (ls->p < ls->pe && ls->p[0] == 0) {  /* Shortcut EOF. */
      ls->p++;
      break;
    }
    bcread_want(ls, 5);
    len = bcread_uleb128(ls);
    if (!len) break;  /* EOF */
    bcread_need(ls, len);
    startp = ls->p;
    pt = lj_bcread_proto(ls);
    if (ls->p != startp + len)
      bcread_error(ls, LJ_ERR_BCBAD);
    setprotoV(L, L->top, pt);
    incr_top(L);
  }
  if ((ls->pe != ls->p && !ls->endmark) || L->top-1 != bcread_oldtop(L, ls))
    bcread_error(ls, LJ_ERR_BCBAD);
  /* Pop off last prototype. */
  L->top--;
  return protoV(L->top);
}